

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O1

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
::Node::primal_dfs(Node *this,
                  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                  *acc)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *local_20;
  
  if (this->visited == false) {
    this->visited = true;
    local_20 = this;
    std::
    vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
    ::emplace_back<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>
              ((vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
                *)acc,&local_20);
    ppNVar1 = (this->edges).
              super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar2 = (this->edges).
                   super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
        ppNVar2 = ppNVar2 + 1) {
      primal_dfs(*ppNVar2,acc);
    }
  }
  return;
}

Assistant:

void primal_dfs(std::vector<const Node *> &acc) const {
            if (visited) return;
            visited = true;
            acc.push_back(this);
            for (auto i: edges) {
                i->primal_dfs(acc);
            }
        }